

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list.hpp
# Opt level: O1

void __thiscall
pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list
          (intrusive_list<(anonymous_namespace)::value> *this)

{
  value *pvVar1;
  _Head_base<0UL,_(anonymous_namespace)::value_*,_false> _Var2;
  pointer *__ptr;
  
  check(this);
  pvVar1 = (this->tail_)._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
           .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
  if (pvVar1 != (value *)0x0) {
    operator_delete(pvVar1,0x18);
  }
  (this->tail_)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
  .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl = (value *)0x0;
  _Var2._M_head_impl =
       (this->head_)._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
       ._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
       .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (value *)0x0) {
    operator_delete(_Var2._M_head_impl,0x18);
  }
  (this->head_)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
  .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl = (value *)0x0;
  return;
}

Assistant:

~intrusive_list () noexcept { this->check (); }